

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ExportDirWrapper::getFieldName
          (QString *__return_storage_ptr__,ExportDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  PEFile *this_00;
  char *ch;
  
  switch(fieldId) {
  case 0:
    ch = "Characteristics";
    break;
  case 1:
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if (((pEVar1 == (Executable *)0x0) ||
        (this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0),
        this_00 == (PEFile *)0x0)) || (bVar2 = PEFile::isReproBuild(this_00), !bVar2)) {
      ch = "TimeDateStamp";
    }
    else {
      ch = "ReproChecksum";
    }
    break;
  case 2:
    ch = "MajorVersion";
    break;
  case 3:
    ch = "MinorVersion";
    break;
  case 4:
    ch = "Name";
    break;
  case 5:
    ch = "Base";
    break;
  case 6:
    ch = "NumberOfFunctions";
    break;
  case 7:
    ch = "NumberOfNames";
    break;
  case 8:
    ch = "AddressOfFunctions";
    break;
  case 9:
    ch = "AddressOfNames";
    break;
  case 10:
    ch = "AddressOfNameOrdinals";
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return "TimeDateStamp";
        }
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case NAME_RVA: return "Name";
        case BASE: return "Base";
        case FUNCTIONS_NUM: return "NumberOfFunctions";
        case NAMES_NUM: return "NumberOfNames";
        case FUNCTIONS_RVA: return "AddressOfFunctions";
        case FUNC_NAMES_RVA: return "AddressOfNames";
        case NAMES_ORDINALS_RVA: return "AddressOfNameOrdinals";
    }
    return getName();
}